

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_92001a::LosslessTestLarge::PreEncodeFrameHook
          (LosslessTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  
  iVar1 = (*video->_vptr_VideoSource[8])(video);
  if (iVar1 != 0) {
    return;
  }
  if ((this->super_EncoderTest).cfg_.rc_min_quantizer != 0 ||
      (this->super_EncoderTest).cfg_.rc_max_quantizer != 0) {
    libaom_test::Encoder::Control(encoder,0x1f,1);
  }
  libaom_test::Encoder::Control(encoder,0xd,this->cpu_used_);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      // Only call Control if quantizer > 0 to verify that using quantizer
      // alone will activate lossless
      if (cfg_.rc_max_quantizer > 0 || cfg_.rc_min_quantizer > 0) {
        encoder->Control(AV1E_SET_LOSSLESS, 1);
      }
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
    }
  }